

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::HugeIntegerCastOperation::
     HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
               (HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> *state,
               int32_t exponent)

{
  ResultType *this;
  uhugeint_t left;
  uhugeint_t left_00;
  uhugeint_t lhs;
  uhugeint_t left_01;
  uhugeint_t right;
  bool bVar1;
  uint uVar2;
  long lVar3;
  uhugeint_t *result;
  uhugeint_t uVar4;
  uhugeint_t input;
  result_t remainder;
  result_t negate_result;
  uhugeint_t local_48;
  uhugeint_t local_30;
  
  bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::Flush(state);
  if (!bVar1) {
    return false;
  }
  if (exponent < -0x26) {
    uhugeint_t::uhugeint_t(&local_48,0);
    (state->result).lower = local_48.lower;
    (state->result).upper = local_48.upper;
    return true;
  }
  uhugeint_t::uhugeint_t(&local_48,0);
  if (exponent < 0) {
    uVar4.lower = (state->result).lower;
    uVar4.upper = (state->result).upper;
    lVar3 = (ulong)(uint)-exponent * 0x10;
    result = *(uhugeint_t **)(Uhugeint::POWERS_OF_TEN + lVar3 + 8);
    uVar4 = Uhugeint::DivMod(uVar4,*(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + lVar3),&local_48);
    (state->result).lower = uVar4.lower;
    (state->result).upper = uVar4.upper;
    uhugeint_t::uhugeint_t(&local_30,0);
    bVar1 = uhugeint_t::operator<(&local_48,&local_30);
    if (bVar1) {
      input.upper = (uint64_t)&local_30;
      input.lower = local_48.upper;
      bVar1 = Uhugeint::TryNegate((Uhugeint *)local_48.lower,input,result);
      if (!bVar1) {
        return false;
      }
      local_48.lower = local_30.lower;
      local_48.upper = local_30.upper;
    }
    (state->decimal).lower = local_48.lower;
    (state->decimal).upper = local_48.upper;
    state->decimal_total_digits = (uint16_t)-exponent;
    uhugeint_t::uhugeint_t(&local_30,0);
    (state->decimal_intermediate).lower = local_30.lower;
    (state->decimal_intermediate).upper = local_30.upper;
    state->decimal_intermediate_digits = 0;
  }
  else {
    uhugeint_t::uhugeint_t(&local_30,0);
    bVar1 = uhugeint_t::operator!=(&state->result,&local_30);
    if (bVar1) {
      if (0x26 < exponent) {
        return false;
      }
      left.lower = (state->result).lower;
      left.upper = (state->result).upper;
      bVar1 = TryMultiplyOperator::
              Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (left,*(uhugeint_t *)
                               (Uhugeint::POWERS_OF_TEN + (ulong)(uint)exponent * 0x10),
                         &state->result);
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long>::FlushDecimal
                      (state);
    if (!bVar1) {
      return false;
    }
    this = &state->decimal;
    uhugeint_t::uhugeint_t(&local_30,0);
    bVar1 = uhugeint_t::operator==(this,&local_30);
    if (!bVar1) {
      uVar2 = exponent - (uint)state->decimal_total_digits;
      if ((int)uVar2 < 0) {
        lhs.lower = (state->decimal).lower;
        lhs.upper = (state->decimal).upper;
        uVar4 = Uhugeint::DivMod(lhs,*(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + (ulong)-uVar2 * 0x10)
                                 ,&local_48);
        (state->decimal).lower = uVar4.lower;
        (state->decimal).upper = uVar4.upper;
        state->decimal_total_digits = state->decimal_total_digits - (short)exponent;
      }
      else {
        if (0x26 < (int)uVar2) {
          return false;
        }
        left_00.lower = (state->decimal).lower;
        left_00.upper = (state->decimal).upper;
        bVar1 = TryMultiplyOperator::
                Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                          (left_00,*(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + (ulong)uVar2 * 0x10),
                           this);
        if (!bVar1) {
          return false;
        }
      }
      left_01.lower = (state->result).lower;
      left_01.upper = (state->result).upper;
      right.lower = (state->decimal).lower;
      right.upper = (state->decimal).upper;
      bVar1 = TrySubtractOperator::
              Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                        (left_01,right,&state->result);
      if (!bVar1) {
        return false;
      }
      this->lower = local_48.lower;
      (state->decimal).upper = local_48.upper;
    }
  }
  bVar1 = Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                    (state);
  return bVar1;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		using result_t = typename T::ResultType;
		if (!state.Flush()) {
			return false;
		}

		int32_t e = exponent;
		if (e < -38) {
			state.result = 0;
			return true;
		}

		// Negative Exponent
		result_t remainder = 0;
		if (e < 0) {
			state.result = T::Operation::DivMod(state.result, T::Operation::POWERS_OF_TEN[-e], remainder);
			if (remainder < 0) {
				result_t negate_result;
				if (!T::Operation::TryNegate(remainder, negate_result)) {
					return false;
				}
				remainder = negate_result;
			}
			state.decimal = remainder;
			state.decimal_total_digits = static_cast<uint16_t>(-e);
			state.decimal_intermediate = 0;
			state.decimal_intermediate_digits = 0;
			return Finalize<T, NEGATIVE>(state);
		}

		// Positive Exponent
		if (state.result != 0) {
			if (e > 38 || !TryMultiplyOperator::Operation(state.result, T::Operation::POWERS_OF_TEN[e], state.result)) {
				return false;
			}
		}
		if (!state.FlushDecimal()) {
			return false;
		}
		if (state.decimal == 0) {
			return Finalize<T, NEGATIVE>(state);
		}

		e = exponent - state.decimal_total_digits;
		if (e < 0) {
			state.decimal = T::Operation::DivMod(state.decimal, T::Operation::POWERS_OF_TEN[-e], remainder);
			state.decimal_total_digits -= (exponent);
		} else {
			if (e > 38 ||
			    !TryMultiplyOperator::Operation(state.decimal, T::Operation::POWERS_OF_TEN[e], state.decimal)) {
				return false;
			}
		}

		if (NEGATIVE) {
			if (!TrySubtractOperator::Operation(state.result, state.decimal, state.result)) {
				return false;
			}
		} else if (!TryAddOperator::Operation(state.result, state.decimal, state.result)) {
			return false;
		}
		state.decimal = remainder;
		return Finalize<T, NEGATIVE>(state);
	}